

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O3

void nhdp_db_neighbor_join(nhdp_neighbor *dst,nhdp_neighbor *src)

{
  list_entity *plVar1;
  avl_node *paVar2;
  list_entity *plVar3;
  list_entity *plVar4;
  list_entity **pplVar5;
  list_entity *plVar6;
  avl_node *paVar7;
  
  if (dst != src) {
    dst->symmetric = dst->symmetric + src->symmetric;
    plVar6 = (src->_links).next;
    if (plVar6->prev != (src->_links).prev) {
      do {
        pplVar5 = &plVar6->prev;
        plVar1 = plVar6->next;
        plVar4 = (((avl_node *)plVar6[-7].next)->list).prev;
        paVar7 = (avl_node *)plVar6[-7].next;
        while (plVar4 != plVar6[-7].prev) {
          paVar2 = (avl_node *)(paVar7->list).next;
          avl_remove(&src->_link_addresses,paVar7);
          avl_insert(&dst->_link_addresses,paVar7);
          paVar7 = paVar2;
          plVar4 = (paVar2->list).prev;
        }
        if ((src->originator)._type != '\0') {
          avl_remove((avl_tree *)(plVar6[-0xc].next + 0x1f),(avl_node *)(plVar6 + 1));
        }
        plVar6[3].prev = (list_entity *)dst;
        if ((dst->originator)._type != '\0') {
          avl_insert((avl_tree *)(plVar6[-0xc].next + 0x1f),(avl_node *)(plVar6 + 1));
        }
        plVar4 = *pplVar5;
        plVar3 = plVar6->next;
        plVar4->next = plVar3;
        plVar3->prev = plVar4;
        *pplVar5 = (list_entity *)0x0;
        plVar6->next = (list_entity *)0x0;
        plVar4 = (dst->_links).prev;
        plVar6->next = &dst->_links;
        *pplVar5 = plVar4;
        (dst->_links).prev = plVar6;
        plVar4->next = plVar6;
        plVar6[-0xb].next = (list_entity *)dst;
        plVar6 = plVar1;
      } while (plVar1->prev != (src->_links).prev);
    }
    paVar7 = (avl_node *)(src->_neigh_addresses).list_head.next;
    if ((paVar7->list).prev != (src->_neigh_addresses).list_head.prev) {
      do {
        paVar2 = (avl_node *)(paVar7->list).next;
        avl_remove(&src->_neigh_addresses,paVar7);
        avl_insert(&dst->_neigh_addresses,paVar7);
        paVar7[-2].list.next = (list_entity *)dst;
        paVar7 = paVar2;
      } while ((paVar2->list).prev != (src->_neigh_addresses).list_head.prev);
    }
    nhdp_db_neighbor_remove(src);
    return;
  }
  return;
}

Assistant:

void
nhdp_db_neighbor_join(struct nhdp_neighbor *dst, struct nhdp_neighbor *src) {
  struct nhdp_naddr *naddr, *na_it;
  struct nhdp_link *lnk, *l_it;
  struct nhdp_laddr *laddr, *la_it;

  if (dst == src) {
    return;
  }

  /* fix symmetric link count */
  dst->symmetric += src->symmetric;

  /* move links */
  list_for_each_element_safe(&src->_links, lnk, _neigh_node, l_it) {
    /* more addresses to new neighbor */
    avl_for_each_element_safe(&lnk->_addresses, laddr, _neigh_node, la_it) {
      avl_remove(&src->_link_addresses, &laddr->_neigh_node);
      avl_insert(&dst->_link_addresses, &laddr->_neigh_node);
    }

    /* move interface based originator */
    if (netaddr_get_address_family(&src->originator) != AF_UNSPEC) {
      avl_remove(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }
    lnk->_originator_node.key = &dst->originator;
    if (netaddr_get_address_family(&dst->originator) != AF_UNSPEC) {
      avl_insert(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }

    /* move link to new neighbor */
    list_remove(&lnk->_neigh_node);
    list_add_tail(&dst->_links, &lnk->_neigh_node);
    lnk->neigh = dst;
  }

  /* move neighbor addresses to target */
  avl_for_each_element_safe(&src->_neigh_addresses, naddr, _neigh_node, na_it) {
    /* move address to new neighbor */
    avl_remove(&src->_neigh_addresses, &naddr->_neigh_node);
    avl_insert(&dst->_neigh_addresses, &naddr->_neigh_node);
    naddr->neigh = dst;
  }

  nhdp_db_neighbor_remove(src);
}